

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O0

int __thiscall zmq::null_mechanism_t::process_handshake_command(null_mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  int iVar2;
  socket_base_t *psVar3;
  int *piVar4;
  endpoint_uri_pair_t *ctx;
  size_t data_size_;
  char *pcVar5;
  null_mechanism_t *in_RSI;
  endpoint_uri_pair_t *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  size_t data_size;
  uchar *cmd_data;
  uchar *in_stack_ffffffffffffffa8;
  null_mechanism_t *in_stack_ffffffffffffffb0;
  socket_base_t *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_4;
  
  if (((in_RDI[1].local.field_0x2 & 1) == 0) && ((in_RDI[1].local.field_0x3 & 1) == 0)) {
    ctx = (endpoint_uri_pair_t *)msg_t::data((msg_t *)in_RDI);
    data_size_ = msg_t::size((msg_t *)in_RDI);
    if ((data_size_ < 6) || (iVar1 = memcmp(ctx,"\x05READY",6), iVar1 != 0)) {
      iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
      if ((data_size_ < 6) || (iVar2 = memcmp(ctx,"\x05ERROR",6), iVar2 != 0)) {
        session_base_t::get_socket(*(session_base_t **)&in_RDI[0x14].local_type);
        ctx = session_base_t::get_endpoint((session_base_t *)0x248e19);
        socket_base_t::event_handshake_failed_protocol(in_stack_ffffffffffffffc0,in_RDI,iVar1);
        piVar4 = __errno_location();
        *piVar4 = 0x47;
        local_2c = -1;
      }
      else {
        local_2c = process_error_command(in_RSI,(uchar *)ctx,data_size_);
      }
    }
    else {
      local_2c = process_ready_command(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x248daa)
      ;
    }
    if (local_2c == 0) {
      iVar1 = msg_t::close((msg_t *)in_RSI,(int)ctx);
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        ctx = (endpoint_uri_pair_t *)0x258315;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/null_mechanism.cpp"
                ,0x9f);
        fflush(_stderr);
        zmq_abort((char *)0x248ebc);
      }
      local_2c = msg_t::init((msg_t *)in_RSI,(EVP_PKEY_CTX *)ctx);
      if (local_2c != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/null_mechanism.cpp"
                ,0xa1);
        fflush(_stderr);
        zmq_abort((char *)0x248f30);
      }
    }
    local_4 = local_2c;
  }
  else {
    psVar3 = session_base_t::get_socket(*(session_base_t **)&in_RDI[0x14].local_type);
    iVar1 = (int)((ulong)psVar3 >> 0x20);
    session_base_t::get_endpoint((session_base_t *)0x248d23);
    socket_base_t::event_handshake_failed_protocol(in_stack_ffffffffffffffc0,in_RDI,iVar1);
    piVar4 = __errno_location();
    *piVar4 = 0x47;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::null_mechanism_t::process_handshake_command (msg_t *msg_)
{
    if (_ready_command_received || _error_command_received) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        return -1;
    }

    const unsigned char *cmd_data =
      static_cast<unsigned char *> (msg_->data ());
    const size_t data_size = msg_->size ();

    int rc = 0;
    if (data_size >= ready_command_name_len
        && !memcmp (cmd_data, ready_command_name, ready_command_name_len))
        rc = process_ready_command (cmd_data, data_size);
    else if (data_size >= error_command_name_len
             && !memcmp (cmd_data, error_command_name, error_command_name_len))
        rc = process_error_command (cmd_data, data_size);
    else {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        rc = -1;
    }

    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}